

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relational_expression(xpath_parser *this)

{
  lexeme_t lVar1;
  xpath_ast_node *right;
  xpath_ast_node *this_00;
  bool bVar2;
  ast_type_t local_48;
  ast_type_t local_44;
  xpath_ast_node *expr;
  xpath_ast_node *pxStack_18;
  lexeme_t l;
  xpath_ast_node *n;
  xpath_parser *this_local;
  
  pxStack_18 = parse_additive_expression(this);
  while( true ) {
    lVar1 = xpath_lexer::current(&this->_lexer);
    bVar2 = true;
    if (lVar1 != lex_less) {
      lVar1 = xpath_lexer::current(&this->_lexer);
      bVar2 = true;
      if (lVar1 != lex_less_or_equal) {
        lVar1 = xpath_lexer::current(&this->_lexer);
        bVar2 = true;
        if (lVar1 != lex_greater) {
          lVar1 = xpath_lexer::current(&this->_lexer);
          bVar2 = lVar1 == lex_greater_or_equal;
        }
      }
    }
    if (!bVar2) break;
    lVar1 = xpath_lexer::current(&this->_lexer);
    xpath_lexer::next(&this->_lexer);
    right = parse_additive_expression(this);
    this_00 = (xpath_ast_node *)alloc_node(this);
    if (lVar1 == lex_less) {
      local_44 = ast_op_less;
    }
    else {
      if (lVar1 == lex_greater) {
        local_48 = ast_op_greater;
      }
      else {
        local_48 = ast_op_greater_or_equal;
        if (lVar1 == lex_less_or_equal) {
          local_48 = ast_op_less_or_equal;
        }
      }
      local_44 = local_48;
    }
    xpath_ast_node::xpath_ast_node(this_00,local_44,xpath_type_boolean,pxStack_18,right);
    pxStack_18 = this_00;
  }
  return pxStack_18;
}

Assistant:

xpath_ast_node* parse_relational_expression()
		{
			xpath_ast_node* n = parse_additive_expression();

			while (_lexer.current() == lex_less || _lexer.current() == lex_less_or_equal || 
				   _lexer.current() == lex_greater || _lexer.current() == lex_greater_or_equal)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				xpath_ast_node* expr = parse_additive_expression();

				n = new (alloc_node()) xpath_ast_node(l == lex_less ? ast_op_less : l == lex_greater ? ast_op_greater :
								l == lex_less_or_equal ? ast_op_less_or_equal : ast_op_greater_or_equal, xpath_type_boolean, n, expr);
			}

			return n;
		}